

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int setupLookaside(sqlite3 *db,void *pBuf,int sz,int cnt)

{
  LookasideSlot **ppLVar1;
  int iVar2;
  LookasideSlot *pLVar3;
  LookasideSlot *pLVar4;
  u32 uVar5;
  int iVar6;
  ulong uVar7;
  LookasideSlot *pLVar8;
  ulong uVar9;
  uint uVar10;
  
  iVar2 = sqlite3LookasideUsed(db,(int *)0x0);
  iVar6 = 5;
  if (iVar2 < 1) {
    if ((db->lookaside).bMalloced != '\0') {
      sqlite3_free((db->lookaside).pStart);
    }
    uVar10 = sz & 0xfffffff8;
    uVar9 = (ulong)uVar10;
    if ((int)uVar10 < 9) {
      uVar9 = 0;
    }
    iVar2 = (int)uVar9;
    uVar7 = (ulong)(uint)cnt;
    if (cnt < 1) {
      uVar7 = 0;
    }
    uVar5 = (u32)uVar7;
    if (cnt < 1 || (int)uVar10 < 9) {
      pLVar3 = (LookasideSlot *)0x0;
      iVar2 = 0;
    }
    else {
      pLVar3 = (LookasideSlot *)pBuf;
      if (pBuf == (void *)0x0) {
        if (sqlite3Hooks_0 != (code *)0x0) {
          (*sqlite3Hooks_0)();
        }
        pLVar3 = (LookasideSlot *)sqlite3Malloc(uVar7 * uVar9);
        if (sqlite3Hooks_1 != (code *)0x0) {
          (*sqlite3Hooks_1)();
        }
        if (pLVar3 == (LookasideSlot *)0x0) {
          pLVar3 = (LookasideSlot *)0x0;
        }
        else {
          iVar6 = (*sqlite3Config.m.xSize)(pLVar3);
          uVar5 = iVar6 / (int)uVar10;
        }
      }
    }
    (db->lookaside).pStart = pLVar3;
    (db->lookaside).pInit = (LookasideSlot *)0x0;
    (db->lookaside).pFree = (LookasideSlot *)0x0;
    (db->lookaside).sz = (u16)iVar2;
    if (pLVar3 == (LookasideSlot *)0x0) {
      (db->lookaside).pStart = db;
      (db->lookaside).pEnd = db;
      (db->lookaside).bDisable = 1;
      (db->lookaside).bMalloced = '\0';
      (db->lookaside).nSlot = 0;
    }
    else {
      (db->lookaside).nSlot = uVar5;
      if (0 < (int)uVar5) {
        ppLVar1 = &(db->lookaside).pInit;
        iVar6 = uVar5 + 1;
        pLVar4 = *ppLVar1;
        pLVar8 = pLVar3;
        do {
          pLVar8->pNext = pLVar4;
          pLVar3 = (LookasideSlot *)((long)&pLVar8->pNext + (long)iVar2);
          iVar6 = iVar6 + -1;
          pLVar4 = pLVar8;
          pLVar8 = pLVar3;
        } while (1 < iVar6);
        *ppLVar1 = (LookasideSlot *)((long)pLVar3 - (long)iVar2);
      }
      (db->lookaside).pEnd = pLVar3;
      (db->lookaside).bDisable = 0;
      (db->lookaside).bMalloced = pBuf == (void *)0x0;
    }
    iVar6 = 0;
  }
  return iVar6;
}

Assistant:

static int setupLookaside(sqlite3 *db, void *pBuf, int sz, int cnt){
#ifndef SQLITE_OMIT_LOOKASIDE
  void *pStart;
  
  if( sqlite3LookasideUsed(db,0)>0 ){
    return SQLITE_BUSY;
  }
  /* Free any existing lookaside buffer for this handle before
  ** allocating a new one so we don't have to have space for 
  ** both at the same time.
  */
  if( db->lookaside.bMalloced ){
    sqlite3_free(db->lookaside.pStart);
  }
  /* The size of a lookaside slot after ROUNDDOWN8 needs to be larger
  ** than a pointer to be useful.
  */
  sz = ROUNDDOWN8(sz);  /* IMP: R-33038-09382 */
  if( sz<=(int)sizeof(LookasideSlot*) ) sz = 0;
  if( cnt<0 ) cnt = 0;
  if( sz==0 || cnt==0 ){
    sz = 0;
    pStart = 0;
  }else if( pBuf==0 ){
    sqlite3BeginBenignMalloc();
    pStart = sqlite3Malloc( sz*(sqlite3_int64)cnt );  /* IMP: R-61949-35727 */
    sqlite3EndBenignMalloc();
    if( pStart ) cnt = sqlite3MallocSize(pStart)/sz;
  }else{
    pStart = pBuf;
  }
  db->lookaside.pStart = pStart;
  db->lookaside.pInit = 0;
  db->lookaside.pFree = 0;
  db->lookaside.sz = (u16)sz;
  if( pStart ){
    int i;
    LookasideSlot *p;
    assert( sz > (int)sizeof(LookasideSlot*) );
    db->lookaside.nSlot = cnt;
    p = (LookasideSlot*)pStart;
    for(i=cnt-1; i>=0; i--){
      p->pNext = db->lookaside.pInit;
      db->lookaside.pInit = p;
      p = (LookasideSlot*)&((u8*)p)[sz];
    }
    db->lookaside.pEnd = p;
    db->lookaside.bDisable = 0;
    db->lookaside.bMalloced = pBuf==0 ?1:0;
  }else{
    db->lookaside.pStart = db;
    db->lookaside.pEnd = db;
    db->lookaside.bDisable = 1;
    db->lookaside.bMalloced = 0;
    db->lookaside.nSlot = 0;
  }
#endif /* SQLITE_OMIT_LOOKASIDE */
  return SQLITE_OK;
}